

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupSiftingAux(DdManager *table,int x,int xLow,int xHigh,DD_CHKFP checkFunction,int lazyFlag)

{
  uint uVar1;
  DdNode *pDVar2;
  uint size;
  int iVar3;
  uint local_58;
  uint local_54;
  int topbot;
  int y;
  int result;
  int initialSize;
  Move *moves;
  Move *move;
  DD_CHKFP p_Stack_30;
  int lazyFlag_local;
  DD_CHKFP checkFunction_local;
  int local_20;
  int xHigh_local;
  int xLow_local;
  int x_local;
  DdManager *table_local;
  
  size = table->keys - table->isolated;
  _result = (DdNode *)0x0;
  originalSize = size;
  local_54 = x;
  move._4_4_ = lazyFlag;
  p_Stack_30 = checkFunction;
  checkFunction_local._4_4_ = xHigh;
  local_20 = xLow;
  xHigh_local = x;
  _xLow_local = table;
  if (x == table->subtables[x].next) {
    while ((local_20 < (int)local_54 &&
           (iVar3 = (*p_Stack_30)(_xLow_local,local_54 - 1,local_54), iVar3 != 0))) {
      uVar1 = _xLow_local->subtables[(int)(local_54 - 1)].next;
      _xLow_local->subtables[(int)(local_54 - 1)].next = local_54;
      _xLow_local->subtables[xHigh_local].next = uVar1;
      local_54 = uVar1;
    }
    local_54 = xHigh_local;
    while (((int)local_54 < checkFunction_local._4_4_ &&
           (iVar3 = (*p_Stack_30)(_xLow_local,local_54,local_54 + 1), iVar3 != 0))) {
      for (local_58 = local_54 + 1; local_58 < _xLow_local->subtables[(int)local_58].next;
          local_58 = _xLow_local->subtables[(int)local_58].next) {
      }
      _xLow_local->subtables[(int)local_58].next = _xLow_local->subtables[(int)local_54].next;
      _xLow_local->subtables[(int)local_54].next = local_54 + 1;
      local_54 = local_58;
    }
  }
  for (; (uint)xHigh_local < _xLow_local->subtables[xHigh_local].next;
      xHigh_local = _xLow_local->subtables[xHigh_local].next) {
  }
  if (xHigh_local == local_20) {
    if (xHigh_local == checkFunction_local._4_4_) {
      return 1;
    }
    iVar3 = ddGroupSiftingDown(_xLow_local,xHigh_local,checkFunction_local._4_4_,p_Stack_30,
                               (Move **)&result);
    if (iVar3 == 0) goto LAB_00a81f58;
    iVar3 = ddGroupSiftingBackward(_xLow_local,(Move *)_result,size,0,move._4_4_);
  }
  else {
    iVar3 = cuddNextHigh(_xLow_local,xHigh_local);
    if (checkFunction_local._4_4_ < iVar3) {
      xHigh_local = _xLow_local->subtables[xHigh_local].next;
      iVar3 = ddGroupSiftingUp(_xLow_local,xHigh_local,local_20,p_Stack_30,(Move **)&result);
      if (iVar3 == 0) goto LAB_00a81f58;
      iVar3 = ddGroupSiftingBackward(_xLow_local,(Move *)_result,size,1,move._4_4_);
    }
    else if (checkFunction_local._4_4_ - xHigh_local < xHigh_local - local_20) {
      iVar3 = ddGroupSiftingDown(_xLow_local,xHigh_local,checkFunction_local._4_4_,p_Stack_30,
                                 (Move **)&result);
      if (iVar3 == 0) goto LAB_00a81f58;
      if (_result != (DdNode *)0x0) {
        xHigh_local = _result->ref;
      }
      for (; (uint)xHigh_local < _xLow_local->subtables[xHigh_local].next;
          xHigh_local = _xLow_local->subtables[xHigh_local].next) {
      }
      xHigh_local = _xLow_local->subtables[xHigh_local].next;
      iVar3 = ddGroupSiftingUp(_xLow_local,xHigh_local,local_20,p_Stack_30,(Move **)&result);
      if (iVar3 == 0) goto LAB_00a81f58;
      iVar3 = ddGroupSiftingBackward(_xLow_local,(Move *)_result,size,1,move._4_4_);
    }
    else {
      xHigh_local = _xLow_local->subtables[xHigh_local].next;
      iVar3 = ddGroupSiftingUp(_xLow_local,xHigh_local,local_20,p_Stack_30,(Move **)&result);
      if (iVar3 == 0) goto LAB_00a81f58;
      if (_result != (DdNode *)0x0) {
        xHigh_local = _result->index;
      }
      for (; (uint)xHigh_local < _xLow_local->subtables[xHigh_local].next;
          xHigh_local = _xLow_local->subtables[xHigh_local].next) {
      }
      iVar3 = ddGroupSiftingDown(_xLow_local,xHigh_local,checkFunction_local._4_4_,p_Stack_30,
                                 (Move **)&result);
      if (iVar3 == 0) goto LAB_00a81f58;
      iVar3 = ddGroupSiftingBackward(_xLow_local,(Move *)_result,size,0,move._4_4_);
    }
  }
  if (iVar3 != 0) {
    while (_result != (DdNode *)0x0) {
      pDVar2 = (_result->type).kids.T;
      _result->ref = 0;
      _result->next = _xLow_local->nextFree;
      _xLow_local->nextFree = _result;
      _result = pDVar2;
    }
    return 1;
  }
LAB_00a81f58:
  while (_result != (DdNode *)0x0) {
    pDVar2 = (_result->type).kids.T;
    _result->ref = 0;
    _result->next = _xLow_local->nextFree;
    _xLow_local->nextFree = _result;
    _result = pDVar2;
  }
  return 0;
}

Assistant:

static int
ddGroupSiftingAux(
  DdManager * table,
  int  x,
  int  xLow,
  int  xHigh,
  DD_CHKFP checkFunction,
  int lazyFlag)
{
    Move *move;
    Move *moves;        /* list of moves */
    int  initialSize;
    int  result;
    int  y;
    int  topbot;

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,
                               "ddGroupSiftingAux from %d to %d\n",xLow,xHigh);
    assert((unsigned) x >= table->subtables[x].next); /* x is bottom of group */
#endif

    initialSize = table->keys - table->isolated;
    moves = NULL;

    originalSize = initialSize;         /* for lazy sifting */

    /* If we have a singleton, we check for aggregation in both
    ** directions before we sift.
    */
    if ((unsigned) x == table->subtables[x].next) {
        /* Will go down first, unless x == xHigh:
        ** Look for aggregation above x.
        */
        for (y = x; y > xLow; y--) {
            if (!checkFunction(table,y-1,y))
                break;
            topbot = table->subtables[y-1].next; /* find top of y-1's group */
            table->subtables[y-1].next = y;
            table->subtables[x].next = topbot; /* x is bottom of group so its */
                                               /* next is top of y-1's group */
            y = topbot + 1; /* add 1 for y--; new y is top of group */
        }
        /* Will go up first unless x == xlow:
        ** Look for aggregation below x.
        */
        for (y = x; y < xHigh; y++) {
            if (!checkFunction(table,y,y+1))
                break;
            /* find bottom of y+1's group */
            topbot = y + 1;
            while ((unsigned) topbot < table->subtables[topbot].next) {
                topbot = table->subtables[topbot].next;
            }
            table->subtables[topbot].next = table->subtables[y].next;
            table->subtables[y].next = y + 1;
            y = topbot - 1; /* subtract 1 for y++; new y is bottom of group */
        }
    }

    /* Now x may be in the middle of a group.
    ** Find bottom of x's group.
    */
    while ((unsigned) x < table->subtables[x].next)
        x = table->subtables[x].next;

    if (x == xLow) { /* Sift down */
#ifdef DD_DEBUG
        /* x must be a singleton */
        assert((unsigned) x == table->subtables[x].next);
#endif
        if (x == xHigh) return(1);      /* just one variable */

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (cuddNextHigh(table,x) > xHigh) { /* Sift up */
#ifdef DD_DEBUG
        /* x is bottom of group */
        assert((unsigned) x >= table->subtables[x].next);
#endif
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xLow, unless early term */

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else if (x - xLow > xHigh - x) { /* must go down first: shorter */
        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        /* Find top of group */
        if (moves) {
            x = moves->y;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
        x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x should be the top of a group */
        assert((unsigned) x <= table->subtables[x].next);
#endif

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_UP,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;

    } else { /* moving up first: shorter */
        /* Find top of x's group */
        x = table->subtables[x].next;

        if (!ddGroupSiftingUp(table,x,xLow,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;
        /* at this point x == xHigh, unless early term */

        if (moves) {
            x = moves->x;
        }
        while ((unsigned) x < table->subtables[x].next)
            x = table->subtables[x].next;
#ifdef DD_DEBUG
        /* x is bottom of a group */
        assert((unsigned) x >= table->subtables[x].next);
#endif

        if (!ddGroupSiftingDown(table,x,xHigh,checkFunction,&moves))
            goto ddGroupSiftingAuxOutOfMem;

        /* move backward and stop at best position */
        result = ddGroupSiftingBackward(table,moves,initialSize,
                                        DD_SIFT_DOWN,lazyFlag);
#ifdef DD_DEBUG
        assert(table->keys - table->isolated <= (unsigned) initialSize);
#endif
        if (!result) goto ddGroupSiftingAuxOutOfMem;
    }

    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(1);

ddGroupSiftingAuxOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}